

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_file.cpp
# Opt level: O0

int write_normal_fill_chunk(output_file *out,uint len,uint32_t fill_val)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  undefined4 in_EDX;
  uint in_ESI;
  long in_RDI;
  uint write_len;
  uint i;
  int ret;
  uint local_20;
  uint local_14;
  long local_10;
  
  for (local_20 = 0; local_14 = in_ESI, local_10 = in_RDI, local_20 < *(uint *)(in_RDI + 0x24) >> 2;
      local_20 = local_20 + 1) {
    *(undefined4 *)(*(long *)(in_RDI + 0x38) + (ulong)local_20 * 4) = in_EDX;
  }
  while( true ) {
    if (local_14 == 0) {
      return 0;
    }
    puVar3 = std::min<unsigned_int>(&local_14,(uint *)(local_10 + 0x24));
    uVar1 = *puVar3;
    iVar2 = (**(code **)(*(long *)(local_10 + 0x10) + 0x18))
                      (local_10,*(undefined8 *)(local_10 + 0x38),uVar1);
    if (iVar2 < 0) break;
    local_14 = local_14 - uVar1;
  }
  return iVar2;
}

Assistant:

static int write_normal_fill_chunk(struct output_file* out, unsigned int len, uint32_t fill_val) {
  int ret;
  unsigned int i;
  unsigned int write_len;

  /* Initialize fill_buf with the fill_val */
  for (i = 0; i < out->block_size / sizeof(uint32_t); i++) {
    out->fill_buf[i] = fill_val;
  }

  while (len) {
    write_len = std::min(len, out->block_size);
    ret = out->ops->write(out, out->fill_buf, write_len);
    if (ret < 0) {
      return ret;
    }

    len -= write_len;
  }

  return 0;
}